

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O0

void DES_ecb_encrypt_ex(uint8_t *in,uint8_t *out,DES_key_schedule *schedule,int is_encrypt)

{
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t ll [2];
  int is_encrypt_local;
  DES_key_schedule *schedule_local;
  uint8_t *out_local;
  uint8_t *in_local;
  
  ll[0] = is_encrypt;
  unique0x10000071 = (DES_key_schedule *)schedule;
  local_2c = CRYPTO_load_u32_le(in);
  local_28 = CRYPTO_load_u32_le(in + 4);
  DES_encrypt1(&local_2c,stack0xffffffffffffffe0,ll[0]);
  CRYPTO_store_u32_le(out,local_2c);
  CRYPTO_store_u32_le(out + 4,local_28);
  return;
}

Assistant:

void DES_ecb_encrypt_ex(const uint8_t in[8], uint8_t out[8],
                        const DES_key_schedule *schedule, int is_encrypt) {
  uint32_t ll[2];
  ll[0] = CRYPTO_load_u32_le(in);
  ll[1] = CRYPTO_load_u32_le(in + 4);
  DES_encrypt1(ll, schedule, is_encrypt);
  CRYPTO_store_u32_le(out, ll[0]);
  CRYPTO_store_u32_le(out + 4, ll[1]);
}